

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fvrf_misc.c
# Opt level: O1

int wrtwrn(FILE *out,char *mess,int isheasarc)

{
  int iVar1;
  size_t sVar2;
  
  iVar1 = 0;
  if ((err_report == 0) && ((isheasarc == 0 || (iVar1 = 0, heasarc_conv != 0)))) {
    nwrns = nwrns + 1;
    builtin_strncpy(temp,"*** Warning: ",0xe);
    strcat(temp,mess);
    if (isheasarc != 0) {
      sVar2 = strlen(temp);
      builtin_strncpy(temp + sVar2 + 0xe,"ention)",8);
      builtin_strncpy(temp + sVar2," (HEASAR",8);
      builtin_strncpy(temp + sVar2 + 8,"C Conven",8);
    }
    print_fmt(out,temp,0xd);
    iVar1 = nwrns;
  }
  return iVar1;
}

Assistant:

int wrtwrn(FILE *out, char *mess, int isheasarc)
{
    if(err_report) return 0;           /* Don't print the warnings */    
    if(!heasarc_conv && isheasarc) return 0;  /* heasarc warnings  but with
                                                 heasarc convention turns off */
    nwrns++;
    strcpy(temp,"*** Warning: ");
    strcat(temp,mess);
    if(isheasarc) strcat(temp," (HEASARC Convention)");
    print_fmt(out,temp,13);
/*    if(nwrns > MAXWRNS ) { 
	 fprintf(stderr,"??? Too many Warnings! I give up...\n");
          
    }  */
    return nwrns;
}